

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.h
# Opt level: O2

void spvtools::utils::AppendToVector
               (string *input,vector<unsigned_int,_std::allocator<unsigned_int>_> *result)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  size_t byte_index;
  ulong uVar4;
  uint32_t word;
  value_type_conflict3 local_2c;
  
  local_2c = 0;
  uVar1 = input->_M_string_length;
  for (uVar4 = 0; uVar4 <= uVar1; uVar4 = uVar4 + 1) {
    uVar2 = 0;
    if (uVar4 < uVar1) {
      uVar2 = (uint)(byte)(input->_M_dataplus)._M_p[uVar4];
    }
    uVar3 = (uint)uVar4 & 3;
    local_2c = local_2c | uVar2 << (char)uVar3 * '\b';
    if (uVar3 == 3) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(result,&local_2c);
      local_2c = 0;
    }
  }
  if (((int)uVar1 + 1U & 3) != 0) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(result,&local_2c);
  }
  return;
}

Assistant:

inline void AppendToVector(const std::string& input,
                           std::vector<uint32_t>* result) {
  uint32_t word = 0;
  size_t num_bytes = input.size();
  // SPIR-V strings are null-terminated.  The byte_index == num_bytes
  // case is used to push the terminating null byte.
  for (size_t byte_index = 0; byte_index <= num_bytes; byte_index++) {
    const auto new_byte =
        (byte_index < num_bytes ? uint8_t(input[byte_index]) : uint8_t(0));
    word |= (new_byte << (8 * (byte_index % sizeof(uint32_t))));
    if (3 == (byte_index % sizeof(uint32_t))) {
      result->push_back(word);
      word = 0;
    }
  }
  // Emit a trailing partial word.
  if ((num_bytes + 1) % sizeof(uint32_t)) {
    result->push_back(word);
  }
}